

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expreplay.h
# Opt level: O2

base_learner *
ExpReplay::expreplay_setup<(char)99,COST_SENSITIVE::cs_label>(options_i *options,vw *all)

{
  undefined8 *puVar1;
  int iVar2;
  option_group_definition *this;
  typed_option<unsigned_long> *op;
  example *peVar3;
  long lVar4;
  bool *pbVar5;
  ostream *poVar6;
  base_learner *l;
  single_learner *base;
  learner<ExpReplay::expreplay,_example> *plVar7;
  size_t n;
  ulong uVar8;
  allocator local_28a;
  allocator local_289;
  free_ptr<ExpReplay::expreplay> er;
  string replay_string;
  string replay_count_string;
  string local_238 [32];
  string local_218;
  string local_1f8 [32];
  string local_1d8;
  string local_1b8;
  option_group_definition new_options;
  undefined1 local_160 [112];
  bool local_f0;
  typed_option<unsigned_long> local_c0;
  
  std::__cxx11::string::string((string *)&replay_string,"replay_",(allocator *)local_160);
  std::__cxx11::string::push_back((char)&replay_string);
  std::__cxx11::string::string((string *)&replay_count_string,(string *)&replay_string);
  std::__cxx11::string::append((char *)&replay_count_string);
  scoped_calloc_or_throw<ExpReplay::expreplay>();
  std::__cxx11::string::string((string *)&local_1b8,"Experience Replay",(allocator *)local_160);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::string((string *)&local_1d8,(string *)&replay_string);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_160,&local_1d8,
             &(er._M_t.super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl)->N);
  local_f0 = true;
  std::__cxx11::string::string
            (local_1f8,
             "use experience replay at a specified level [b=classification/regression, m=multiclass, c=cost sensitive] with specified buffer size"
             ,&local_289);
  std::__cxx11::string::_M_assign((string *)(local_160 + 0x30));
  this = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                   (&new_options,(typed_option<unsigned_long> *)local_160);
  std::__cxx11::string::string((string *)&local_218,(string *)&replay_count_string);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_c0,&local_218,
             &(er._M_t.super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl)->replay_count);
  op = VW::config::typed_option<unsigned_long>::default_value(&local_c0,1);
  std::__cxx11::string::string
            (local_238,
             "how many times (in expectation) should each example be played (default: 1 = permuting)"
             ,&local_28a);
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>(this,op);
  std::__cxx11::string::~string(local_238);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_c0);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string(local_1f8);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_160);
  std::__cxx11::string::~string((string *)&local_1d8);
  (**options->_vptr_options_i)(options,&new_options);
  iVar2 = (*options->_vptr_options_i[1])(options,&replay_string);
  if (((char)iVar2 == '\0') ||
     ((er._M_t.super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl)->N == 0)) {
    plVar7 = (learner<ExpReplay::expreplay,_example> *)0x0;
  }
  else {
    (er._M_t.super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl)->all = all;
    peVar3 = VW::alloc_examples(1,(er._M_t.
                                   super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
                                   super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl
                                  )->N);
    (er._M_t.super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl)->buf = peVar3;
    lVar4 = 0x6828;
    for (uVar8 = 0;
        uVar8 < (er._M_t.super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
                 super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl)->N;
        uVar8 = uVar8 + 1) {
      peVar3 = (er._M_t.super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
                super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl)->buf;
      puVar1 = (undefined8 *)((long)(peVar3->super_example_predict).feature_space + lVar4 + -0x10);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(peVar3->super_example_predict).feature_space + lVar4 + -0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar4 = lVar4 + 0x68d0;
    }
    pbVar5 = calloc_or_throw<bool>
                       ((er._M_t.super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>._M_t.
                         super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
                         super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl)->N);
    (er._M_t.super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl)->filled = pbVar5;
    if (all->quiet == false) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"experience replay level=");
      poVar6 = std::operator<<(poVar6,'c');
      poVar6 = std::operator<<(poVar6,", buffer=");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6,", replay count=");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    (er._M_t.super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl)->base = base;
    plVar7 = LEARNER::init_learner<ExpReplay::expreplay,example,LEARNER::learner<char,example>>
                       (&er,base,predict_or_learn<true,COST_SENSITIVE::cs_label>,
                        predict_or_learn<false,COST_SENSITIVE::cs_label>);
    *(undefined8 *)(plVar7 + 0xb8) = *(undefined8 *)(plVar7 + 0x18);
    *(undefined8 *)(plVar7 + 0xc0) = *(undefined8 *)(plVar7 + 0x20);
    *(code **)(plVar7 + 200) = finish<COST_SENSITIVE::cs_label>;
    *(undefined8 *)(plVar7 + 0x88) = *(undefined8 *)(plVar7 + 0x18);
    *(undefined8 *)(plVar7 + 0x90) = *(undefined8 *)(plVar7 + 0x20);
    *(code **)(plVar7 + 0x98) = end_pass;
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::~unique_ptr(&er);
  std::__cxx11::string::~string((string *)&replay_count_string);
  std::__cxx11::string::~string((string *)&replay_string);
  return (base_learner *)plVar7;
}

Assistant:

LEARNER::base_learner* expreplay_setup(VW::config::options_i& options, vw& all)
{
  std::string replay_string = "replay_";
  replay_string += er_level;
  std::string replay_count_string = replay_string;
  replay_count_string += "_count";

  auto er = scoped_calloc_or_throw<expreplay>();
  VW::config::option_group_definition new_options("Experience Replay");
  new_options
      .add(VW::config::make_option(replay_string, er->N)
               .keep()
               .help("use experience replay at a specified level [b=classification/regression, m=multiclass, c=cost "
                     "sensitive] with specified buffer size"))
      .add(VW::config::make_option(replay_count_string, er->replay_count)
               .default_value(1)
               .help("how many times (in expectation) should each example be played (default: 1 = permuting)"));
  options.add_and_parse(new_options);

  if (!options.was_supplied(replay_string) || er->N == 0)
    return nullptr;

  er->all = &all;
  er->buf = VW::alloc_examples(1, er->N);

  if (er_level == 'c')
    for (size_t n = 0; n < er->N; n++) er->buf[n].l.cs.costs = v_init<COST_SENSITIVE::wclass>();

  er->filled = calloc_or_throw<bool>(er->N);

  if (!all.quiet)
    std::cerr << "experience replay level=" << er_level << ", buffer=" << er->N << ", replay count=" << er->replay_count
              << std::endl;

  er->base = LEARNER::as_singleline(setup_base(options, all));
  LEARNER::learner<expreplay, example>* l =
      &init_learner(er, er->base, predict_or_learn<true, lp>, predict_or_learn<false, lp>);
  l->set_finish(finish<lp>);
  l->set_end_pass(end_pass);

  return make_base(*l);
}